

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O3

void __thiscall vector_digest_test::test_method(vector_digest_test *this)

{
  int iVar1;
  initializer_list<char> __l;
  undefined **local_130;
  undefined1 local_128;
  undefined8 *local_120;
  char **local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  string **local_f8;
  digest_type hash;
  vector<char,_std::allocator<char>_> vector;
  char *local_c8;
  string *local_c0;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  shared_count sStack_a8;
  string str;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  char *local_38;
  
  local_110 = (undefined **)CONCAT44(local_110._4_4_,0x4030201);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_110;
  std::vector<char,_std::allocator<char>_>::vector(&vector,__l,(allocator_type *)&local_130);
  hash._M_elems =
       (_Type)cryptox::
              digest<cryptox::message_digest_algorithm<&EVP_md5,128ul>,std::vector<char,std::allocator<char>>>
                        (&vector);
  cryptox::to_hex<unsigned_char_const*>(&str,(cryptox *)&hash,(uchar *)&vector,(uchar *)&vector);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_68 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x32);
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_002e0fe0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  iVar1 = std::__cxx11::string::compare((char *)&str);
  local_b8[0] = iVar1 == 0;
  local_b0 = 0;
  sStack_a8.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_58 = "";
  local_f8 = &local_c0;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_002e1030;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &local_c8;
  local_c8 = "08d6c05a21512a79a1dfeb9d2a8f262f";
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_002e1460;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &str;
  boost::test_tools::tt_detail::report_assertion
            (local_b8,&local_50,&local_60,0x32,1,2,2,"str",&local_110,
             "\"08d6c05a21512a79a1dfeb9d2a8f262f\"",&local_130);
  boost::detail::shared_count::~shared_count(&sStack_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p);
  }
  if (vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(vector_digest_test) {
	const std::vector<char> vector = { 1, 2, 3, 4 };
	const md5::digest_type hash = digest<md5>(vector);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "08d6c05a21512a79a1dfeb9d2a8f262f");
}